

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O3

void __thiscall cmComputeComponentGraph::TarjanVisit(cmComputeComponentGraph *this,int i)

{
  pointer *ppcVar1;
  int iVar2;
  pointer pTVar3;
  int *piVar4;
  pointer pcVar5;
  pointer pcVar6;
  iterator __position;
  iterator __position_00;
  long lVar7;
  long lVar8;
  long lVar9;
  _Elt_pointer piVar10;
  ulong uVar11;
  int iVar12;
  cmGraphEdge *ni;
  pointer pcVar13;
  vector<int,std::allocator<int>> *this_00;
  int j;
  int local_38;
  int local_34;
  
  lVar9 = (long)i;
  (this->TarjanVisited).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar9] = this->TarjanWalkId;
  pTVar3 = (this->TarjanEntries).
           super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar3[lVar9].Root = i;
  (this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar9] = -1;
  iVar12 = this->TarjanIndex + 1;
  this->TarjanIndex = iVar12;
  pTVar3[lVar9].VisitIndex = iVar12;
  piVar4 = (this->TarjanStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  local_34 = i;
  if (piVar4 == (this->TarjanStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)&this->TarjanStack,&local_34);
    lVar9 = (long)local_34;
  }
  else {
    *piVar4 = i;
    (this->TarjanStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = piVar4 + 1;
  }
  pcVar5 = (this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar13 = *(pointer *)&pcVar5[lVar9].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
  pcVar6 = *(pointer *)((long)(pcVar5 + lVar9) + 8);
  if (pcVar13 != pcVar6) {
    do {
      iVar12 = pcVar13->Dest;
      iVar2 = (this->TarjanVisited).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar12];
      if (iVar2 < 1) {
        if (iVar2 == 0) {
          TarjanVisit(this,iVar12);
        }
LAB_0037c564:
        if ((this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar12] < 0) {
          pTVar3 = (this->TarjanEntries).
                   super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (pTVar3[pTVar3[iVar12].Root].VisitIndex < pTVar3[pTVar3[local_34].Root].VisitIndex) {
            pTVar3[local_34].Root = pTVar3[iVar12].Root;
          }
        }
      }
      else if (this->TarjanWalkId <= iVar2) goto LAB_0037c564;
      pcVar13 = pcVar13 + 1;
    } while (pcVar13 != pcVar6);
    lVar9 = (long)local_34;
  }
  if ((this->TarjanEntries).
      super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9].Root == local_34) {
    __position._M_current =
         (this->Components).super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    iVar12 = (int)((long)__position._M_current -
                   (long)(this->Components).
                         super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
    if (__position._M_current ==
        (this->Components).super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::_M_realloc_insert<>
                (&this->Components,__position);
    }
    else {
      ((__position._M_current)->super_vector<int,_std::allocator<int>_>).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      ((__position._M_current)->super_vector<int,_std::allocator<int>_>).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      ((__position._M_current)->super_vector<int,_std::allocator<int>_>).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ppcVar1 = &(this->Components).
                 super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    this_00 = (vector<int,std::allocator<int>> *)
              ((this->Components).
               super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
               super__Vector_impl_data._M_start + iVar12);
    do {
      piVar10 = (this->TarjanStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      if (piVar10 ==
          (this->TarjanStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        piVar10 = (this->TarjanStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      local_38 = piVar10[-1];
      std::deque<int,_std::allocator<int>_>::pop_back(&(this->TarjanStack).c);
      (this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[local_38] = iVar12;
      (this->TarjanEntries).
      super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
      ._M_impl.super__Vector_impl_data._M_start[local_38].Root = local_34;
      __position_00._M_current = *(int **)(this_00 + 8);
      if (__position_00._M_current == *(int **)(this_00 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this_00,__position_00,&local_38);
      }
      else {
        *__position_00._M_current = local_38;
        *(int **)(this_00 + 8) = __position_00._M_current + 1;
      }
    } while (local_38 != local_34);
    lVar9 = *(long *)this_00;
    lVar7 = *(long *)(this_00 + 8);
    if (lVar9 != lVar7) {
      uVar11 = lVar7 - lVar9 >> 2;
      lVar8 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (lVar9,lVar7,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (lVar9,lVar7);
    }
  }
  return;
}

Assistant:

void cmComputeComponentGraph::TarjanVisit(int i)
{
  // We are now visiting this node.
  this->TarjanVisited[i] = this->TarjanWalkId;

  // Initialize the entry.
  this->TarjanEntries[i].Root = i;
  this->TarjanComponents[i] = -1;
  this->TarjanEntries[i].VisitIndex = ++this->TarjanIndex;
  this->TarjanStack.push(i);

  // Follow outgoing edges.
  EdgeList const& nl = this->InputGraph[i];
  for (cmGraphEdge const& ni : nl) {
    int j = ni;

    // Ignore edges to nodes that have been reached by a previous DFS
    // walk.  Since we did not reach the current node from that walk
    // it must not belong to the same component and it has already
    // been assigned to a component.
    if (this->TarjanVisited[j] > 0 &&
        this->TarjanVisited[j] < this->TarjanWalkId) {
      continue;
    }

    // Visit the destination if it has not yet been visited.
    if (!this->TarjanVisited[j]) {
      this->TarjanVisit(j);
    }

    // If the destination has not yet been assigned to a component,
    // check if it has a better root for the current object.
    if (this->TarjanComponents[j] < 0) {
      if (this->TarjanEntries[this->TarjanEntries[j].Root].VisitIndex <
          this->TarjanEntries[this->TarjanEntries[i].Root].VisitIndex) {
        this->TarjanEntries[i].Root = this->TarjanEntries[j].Root;
      }
    }
  }

  // Check if we have found a component.
  if (this->TarjanEntries[i].Root == i) {
    // Yes.  Create it.
    int c = static_cast<int>(this->Components.size());
    this->Components.emplace_back();
    NodeList& component = this->Components[c];

    // Populate the component list.
    int j;
    do {
      // Get the next member of the component.
      j = this->TarjanStack.top();
      this->TarjanStack.pop();

      // Assign the member to the component.
      this->TarjanComponents[j] = c;
      this->TarjanEntries[j].Root = i;

      // Store the node in its component.
      component.push_back(j);
    } while (j != i);

    // Sort the component members for clarity.
    std::sort(component.begin(), component.end());
  }
}